

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

void __thiscall QColumnViewPrivate::setPreviewWidget(QColumnViewPrivate *this,QWidget *widget)

{
  long lVar1;
  QWidgetData *pQVar2;
  QColumnViewPreviewColumn *this_00;
  QScrollBar *pQVar3;
  QSize QVar4;
  QWidget *pQVar5;
  Representation w;
  
  pQVar5 = *(QWidget **)
            &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
             super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  if (this->previewColumn != (QAbstractItemView *)0x0) {
    lVar1 = (this->columns).d.size;
    if ((lVar1 != 0) && ((this->columns).d.ptr[lVar1 + -1] == this->previewColumn)) {
      QList<QAbstractItemView_*>::removeLast(&this->columns);
    }
    QObject::deleteLater();
  }
  this_00 = (QColumnViewPreviewColumn *)operator_new(0x30);
  QColumnViewPreviewColumn::QColumnViewPreviewColumn(this_00,pQVar5);
  QColumnViewPreviewColumn::setPreviewWidget(this_00,widget);
  this->previewColumn = (QAbstractItemView *)this_00;
  QWidget::hide((QWidget *)this_00);
  QFrame::setFrameShape((QFrame *)this->previewColumn,NoFrame);
  QAbstractScrollArea::setVerticalScrollBarPolicy
            ((QAbstractScrollArea *)this->previewColumn,ScrollBarAlwaysOn);
  QAbstractItemView::setSelectionMode((QAbstractItemView *)this->previewColumn,NoSelection);
  pQVar5 = (QWidget *)this->previewColumn;
  pQVar3 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)pQVar5);
  pQVar2 = (pQVar3->super_QAbstractSlider).super_QWidget.data;
  w.m_i = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
  QVar4 = QWidget::minimumSize((QWidget *)this->previewColumn);
  if (w.m_i <= QVar4.wd.m_i.m_i) {
    w.m_i = QVar4.wd.m_i.m_i;
  }
  QWidget::setMinimumWidth(pQVar5,w.m_i);
  this->previewWidget = widget;
  pQVar5 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this->previewColumn);
  QWidget::setParent(widget,pQVar5);
  return;
}

Assistant:

void QColumnViewPrivate::setPreviewWidget(QWidget *widget)
{
    Q_Q(QColumnView);
    if (previewColumn) {
        if (!columns.isEmpty() && columns.constLast() == previewColumn)
            columns.removeLast();
        previewColumn->deleteLater();
    }
    QColumnViewPreviewColumn *column = new QColumnViewPreviewColumn(q);
    column->setPreviewWidget(widget);
    previewColumn = column;
    previewColumn->hide();
    previewColumn->setFrameShape(QFrame::NoFrame);
    previewColumn->setVerticalScrollBarPolicy(Qt::ScrollBarAlwaysOn);
    previewColumn->setSelectionMode(QAbstractItemView::NoSelection);
    previewColumn->setMinimumWidth(qMax(previewColumn->verticalScrollBar()->width(),
                previewColumn->minimumWidth()));
    previewWidget = widget;
    previewWidget->setParent(previewColumn->viewport());
}